

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterThunkEmitter.cpp
# Opt level: O2

BYTE * __thiscall ThunkBlock::AllocateFromFreeList(ThunkBlock *this)

{
  code *pcVar1;
  bool bVar2;
  BVIndex index;
  undefined4 *puVar3;
  BYTE *pBVar4;
  BVFixed *this_00;
  
  this_00 = this->freeList;
  if (this_00 == (BVFixed *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InterpreterThunkEmitter.cpp"
                       ,0x39b,"(this->freeList)","this->freeList");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
    this_00 = this->freeList;
  }
  index = BVFixed::GetNextBit(this_00,0);
  pBVar4 = ToThunkAddress(this,index);
  BVFixed::Clear(this->freeList,index);
  return pBVar4;
}

Assistant:

BYTE* ThunkBlock::AllocateFromFreeList()
{
    Assert(this->freeList);
    BVIndex index = this->freeList->GetNextBit(0);
    BYTE* address = ToThunkAddress(index);
    this->freeList->Clear(index);
    return address;
}